

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1dec.c
# Opt level: O1

int jpc_dec_decodecblks(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  byte *pbVar1;
  ulong *puVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  jpc_dec_tcomp_t *pjVar7;
  jas_matrix_t *pjVar8;
  jpc_mqstate_t *pjVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  jas_matrix_t *pjVar19;
  jpc_mqdec_t *pjVar20;
  jpc_bitstream_t *pjVar21;
  ulong uVar22;
  undefined8 uVar23;
  byte bVar24;
  uint uVar25;
  jpc_dec_prc_t *pjVar26;
  uint_fast32_t uVar27;
  int iVar28;
  jpc_dec_rlvl_t *pjVar29;
  int iVar30;
  int iVar31;
  jpc_dec_tcomp_t *pjVar32;
  uint *puVar33;
  jas_seqent_t *pjVar34;
  int iVar35;
  jpc_dec_band_t *pjVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  jas_seqent_t *pjVar43;
  long *plVar44;
  jas_seqent_t *pjVar45;
  jpc_dec_tile_t *pjVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  jpc_dec_cblk_t *pjVar50;
  long lVar51;
  int iVar52;
  jpc_dec_seg_t *seg;
  jpc_dec_seg_t *pjVar53;
  bool bVar54;
  bool bVar55;
  jas_seqent_t *local_180;
  jas_seqent_t *local_170;
  jas_seqent_t *local_168;
  jas_seqent_t *local_160;
  jas_seqent_t *local_158;
  jas_seqent_t *local_128;
  jas_seqent_t *local_120;
  jas_seqent_t *local_110;
  jas_seqent_t *local_108;
  jas_seqent_t *local_100;
  jas_seqent_t *local_f8;
  jas_seqent_t *local_f0;
  jas_seqent_t *local_e8;
  jas_seqent_t *local_e0;
  jas_seqent_t *local_d8;
  jas_seqent_t *local_d0;
  jas_seqent_t *local_c8;
  jas_seqent_t *local_c0;
  jas_seqent_t *local_b8;
  int local_a8;
  ulong local_a0;
  
  if (0 < dec->numcomps) {
    pjVar32 = tile->tcomps;
    iVar10 = dec->numcomps;
    do {
      if (0 < (int)pjVar32->numrlvls) {
        pjVar29 = pjVar32->rlvls;
        uVar11 = pjVar32->numrlvls;
        do {
          pjVar36 = pjVar29->bands;
          if ((pjVar36 != (jpc_dec_band_t *)0x0) && (iVar5 = pjVar29->numbands, 0 < iVar5)) {
            do {
              if ((pjVar36->data != (jas_matrix_t *)0x0) && (0 < pjVar29->numprcs)) {
                pjVar26 = pjVar36->prcs;
                iVar12 = pjVar29->numprcs;
                do {
                  pjVar50 = pjVar26->cblks;
                  if ((pjVar50 != (jpc_dec_cblk_t *)0x0) && (iVar6 = pjVar26->numcblks, 0 < iVar6))
                  {
                    do {
                      pjVar7 = tile->tcomps;
                      if (pjVar50->flags == (jas_matrix_t *)0x0) {
                        pjVar19 = jas_matrix_create(pjVar50->data->numrows_ + 2,
                                                    pjVar50->data->numcols_ + 2);
                        pjVar50->flags = pjVar19;
                        if (pjVar19 == (jas_matrix_t *)0x0) {
                          return -1;
                        }
                      }
                      seg = (pjVar50->segs).head;
                      if (seg != (jpc_dec_seg_t *)0x0) {
                        iVar30 = (int)((ulong)((long)pjVar32 - (long)pjVar7) >> 6);
                        while (seg->lyrno < 0x4000) {
                          if (seg->stream == (jas_stream_t *)0x0) {
                            __assert_fail("seg->stream",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                          ,0xd7,
                                          "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                         );
                          }
                          jas_stream_rewind(seg->stream);
                          jas_stream_setrwcount(seg->stream,0);
                          if (seg->type == 2) {
                            if (pjVar50->nulldec == (jpc_bitstream_t *)0x0) {
                              pjVar21 = jpc_bitstream_sopen(seg->stream,"r");
                              pjVar50->nulldec = pjVar21;
                              if (pjVar21 == (jpc_bitstream_t *)0x0) {
                                __assert_fail("0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                              ,0xe7,
                                              "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                             );
                              }
                            }
                          }
                          else {
                            if (seg->type != 1) {
                              __assert_fail("seg->type == JPC_SEG_RAW",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                            ,0xe4,
                                            "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                           );
                            }
                            if (pjVar50->mqdec == (jpc_mqdec_t *)0x0) {
                              pjVar20 = jpc_mqdec_create(0x13,(jas_stream_t *)0x0);
                              pjVar50->mqdec = pjVar20;
                              if (pjVar20 == (jpc_mqdec_t *)0x0) {
                                return -1;
                              }
                              jpc_mqdec_setctxs(pjVar20,0x13,jpc_mqctxs);
                            }
                            jpc_mqdec_setinput(pjVar50->mqdec,seg->stream);
                            jpc_mqdec_init(pjVar50->mqdec);
                          }
                          if (0 < seg->numpasses) {
                            iVar31 = 0;
LAB_0012713b:
                            if ((pjVar36->numbps < pjVar50->numimsbs) &&
                               ((bVar24 = tile->cp->ccps[iVar30].roishift, bVar24 == 0 ||
                                (pjVar50->numimsbs < (int)((uint)bVar24 - pjVar36->numbps))))) {
                              jas_eprintf("warning: corrupt code stream\n");
                            }
                            iVar13 = seg->passno + iVar31;
                            uVar25 = ~(((iVar13 - pjVar50->firstpassno) + 2) / 3 + pjVar50->numimsbs
                                      ) + pjVar36->numbps + pjVar36->roishift;
                            if (-1 < (int)uVar25) {
                              if (0x1e < (int)uVar25) {
                                __assert_fail("bpno >= 0 && bpno < 31",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                              ,0x102,
                                              "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                             );
                              }
                              uVar37 = (iVar13 + 2) % 3;
                              bVar24 = (byte)uVar25;
                              if (uVar37 == 2) {
                                if (seg->type != 1) {
                                  __assert_fail("seg->type == JPC_SEG_MQ",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                ,0x117,
                                                "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                               );
                                }
                                pjVar19 = pjVar50->flags;
                                if (pjVar19->numrows_ < 2) {
                                  local_a0 = 0;
                                }
                                else {
                                  local_a0 = (long)pjVar19->rows_[1] - (long)*pjVar19->rows_ >> 3;
                                }
                                pjVar8 = pjVar50->data;
                                if (pjVar8->numrows_ < 2) {
                                  local_a8 = 0;
                                }
                                else {
                                  local_a8 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                }
                                pjVar20 = pjVar50->mqdec;
                                bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                iVar13 = (int)pjVar8->numrows_;
                                if (0 < iVar13) {
                                  uVar47 = (uint)(1 << (bVar24 & 0x1f)) >> 1 | 1 << (uVar25 & 0x1f);
                                  uVar25 = (uint)pjVar8->numcols_;
                                  plVar44 = (long *)(ulong)uVar25;
                                  pjVar34 = *pjVar8->rows_;
                                  local_d8 = pjVar19->rows_[1];
                                  local_170 = local_d8 + 1;
                                  iVar38 = (int)local_a0;
                                  iVar28 = iVar38 * 4;
                                  lVar42 = (long)iVar38;
                                  uVar18 = pjVar36->orient << 8;
                                  uVar48 = -uVar47;
                                  local_a0 = local_a0 & 0xffffffff;
                                  lVar41 = (long)local_a8;
                                  local_c8 = local_d8 + lVar42 * 3 + 1;
                                  local_e0 = local_d8 + lVar42 * 2 + 1;
                                  local_d8 = local_d8 + lVar42 + 1;
                                  iVar17 = 0;
                                  pjVar46 = tile;
                                  pjVar53 = seg;
                                  do {
                                    iVar14 = iVar13 - iVar17;
                                    iVar49 = 4;
                                    if (iVar14 < 4) {
                                      iVar49 = iVar14;
                                    }
                                    if (0 < (int)uVar25) {
                                      lVar51 = 0;
                                      local_100 = local_170;
                                      iVar35 = uVar25 + 1;
                                      do {
                                        puVar33 = (uint *)((long)local_170 + lVar51);
                                        if ((((3 < iVar14) && ((*puVar33 & 0x50ff) == 0)) &&
                                            ((*(ushort *)((long)local_d8 + lVar51) & 0x50ff) == 0))
                                           && (((*(ushort *)((long)local_e0 + lVar51) & 0x50ff) == 0
                                               && ((*(ushort *)((long)local_c8 + lVar51) & 0x50ff)
                                                   == 0)))) {
                                          pjVar20->curctx = pjVar20->ctxs;
                                          pjVar9 = *pjVar20->ctxs;
                                          uVar22 = pjVar9->qeval;
                                          uVar27 = pjVar20->areg - uVar22;
                                          pjVar20->areg = uVar27;
                                          if (pjVar20->creg >> 0x10 < uVar22) {
                                            uVar15 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                          }
                                          else {
                                            pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                            if ((short)uVar27 < 0) {
                                              uVar15 = (uint)pjVar9->mps;
                                            }
                                            else {
                                              uVar15 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                            }
                                          }
                                          if (uVar15 == 0) {
                                            puVar33 = (uint *)(local_100 + lVar42 * 3);
                                            uVar23 = 7;
                                          }
                                          else {
                                            pjVar20->curctx = pjVar20->ctxs + 0x12;
                                            pjVar9 = pjVar20->ctxs[0x12];
                                            uVar22 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar22;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar22) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            pjVar9 = *pjVar20->curctx;
                                            uVar22 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar22;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar22) {
                                              uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar16 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            uVar16 = uVar15 * 2 | uVar16;
                                            puVar33 = (uint *)(lVar51 + (long)(int)(uVar16 * iVar38)
                                                                        * 8 + (long)local_170);
                                            pjVar46 = (jpc_dec_tile_t *)
                                                      (ulong)*(uint *)((long)local_170 +
                                                                      lVar51 + (long)(int)(uVar16 * 
                                                  iVar38) * 8);
                                            plVar44 = (long *)(lVar51 + (long)(int)(uVar16 * 
                                                  local_a8) * 8 + (long)pjVar34);
                                            pjVar53 = (jpc_dec_seg_t *)(ulong)(iVar49 - uVar16);
                                            switch(uVar16) {
                                            case 0:
                                              uVar23 = 9;
                                              break;
                                            case 1:
                                              uVar23 = 10;
                                              break;
                                            case 2:
                                              uVar23 = 0xb;
                                              break;
                                            case 3:
                                              uVar23 = 0xc;
                                              break;
                                            default:
                                              uVar23 = 0;
                                            }
                                          }
                                          iVar52 = (int)pjVar53;
                                          switch(uVar23) {
                                          case 0:
                                            goto switchD_00128002_caseD_0;
                                          default:
                                            goto switchD_00128002_caseD_1;
                                          case 7:
                                            goto switchD_00128002_caseD_7;
                                          }
                                        }
                                        plVar44 = (long *)(lVar51 + (long)pjVar34);
                                        pjVar46 = (jpc_dec_tile_t *)(ulong)*puVar33;
                                        iVar52 = iVar49;
switchD_00128002_caseD_0:
                                        if (((ulong)pjVar46 & 0x5000) == 0) {
                                          bVar24 = jpc_zcctxnolut[(uint)pjVar46 & 0xff | uVar18];
                                          pjVar20->curctx = pjVar20->ctxs + bVar24;
                                          pjVar9 = pjVar20->ctxs[bVar24];
                                          uVar22 = pjVar9->qeval;
                                          uVar27 = pjVar20->areg - uVar22;
                                          pjVar20->areg = uVar27;
                                          if (pjVar20->creg >> 0x10 < uVar22) {
                                            uVar15 = jpc_mqdec_lpsexchrenormd(pjVar20);
LAB_001275d4:
                                            pjVar46 = (jpc_dec_tile_t *)
                                                      ((ulong)pjVar46 & 0xffffffff);
                                          }
                                          else {
                                            pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                            if (-1 < (short)uVar27) {
                                              uVar15 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              goto LAB_001275d4;
                                            }
                                            uVar15 = (uint)pjVar9->mps;
                                          }
                                          if (uVar15 != 0) {
                                            uVar39 = (ulong)pjVar46 >> 4 & 0xff;
                                            bVar24 = jpc_scctxnolut[uVar39];
                                            pjVar20->curctx = pjVar20->ctxs + bVar24;
                                            pjVar9 = pjVar20->ctxs[bVar24];
                                            uVar22 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar22;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar22) {
                                              uVar15 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar15 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar15 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            _Var4 = jpc_spblut[uVar39];
                                            uVar16 = uVar48;
                                            if (uVar15 == _Var4) {
                                              uVar16 = uVar47;
                                            }
                                            *plVar44 = (long)(int)uVar16;
                                            if ((bVar3 & 8) == 0) {
                                              *(byte *)(puVar33 + local_a0 * -2 + -2) =
                                                   (byte)puVar33[local_a0 * -2 + -2] | 2;
                                              *(byte *)(puVar33 + local_a0 * -2 + 2) =
                                                   (byte)puVar33[local_a0 * -2 + 2] | 4;
                                              *(byte *)(puVar33 + local_a0 * 2 + -2) =
                                                   (byte)puVar33[local_a0 * 2 + -2] | 1;
                                              *(byte *)(puVar33 + local_a0 * 2 + 2) =
                                                   (byte)puVar33[local_a0 * 2 + 2] | 8;
                                              if (uVar15 == _Var4) {
                                                *(ulong *)(puVar33 + local_a0 * -2) =
                                                     *(ulong *)(puVar33 + local_a0 * -2) | 0x40;
                                                uVar22 = *(ulong *)(puVar33 + local_a0 * 2);
                                                goto LAB_0012771d;
                                              }
                                              *(ulong *)(puVar33 + local_a0 * -2) =
                                                   *(ulong *)(puVar33 + local_a0 * -2) | 0x440;
                                              uVar22 = *(ulong *)(puVar33 + local_a0 * 2);
LAB_0012774d:
                                              uVar22 = uVar22 | 0x110;
                                              uVar39 = 0x880;
                                              uVar40 = 0x220;
                                            }
                                            else {
                                              *(byte *)(puVar33 + local_a0 * 2 + -2) =
                                                   (byte)puVar33[local_a0 * 2 + -2] | 1;
                                              *(byte *)(puVar33 + local_a0 * 2 + 2) =
                                                   (byte)puVar33[local_a0 * 2 + 2] | 8;
                                              uVar22 = *(ulong *)(puVar33 + local_a0 * 2);
                                              if (uVar15 != _Var4) goto LAB_0012774d;
LAB_0012771d:
                                              uVar22 = uVar22 | 0x10;
                                              uVar39 = 0x80;
                                              uVar40 = 0x20;
                                            }
                                            pjVar46 = (jpc_dec_tile_t *)
                                                      ((ulong)pjVar46 & 0xffffffff);
                                            *(ulong *)(puVar33 + local_a0 * 2) = uVar22;
                                            *(ulong *)(puVar33 + -2) =
                                                 *(ulong *)(puVar33 + -2) | uVar40;
                                            *(ulong *)(puVar33 + 2) =
                                                 *(ulong *)(puVar33 + 2) | uVar39;
                                            *(byte *)((long)puVar33 + 1) =
                                                 *(byte *)((long)puVar33 + 1) | 0x10;
                                          }
                                        }
                                        *(byte *)((long)puVar33 + 1) =
                                             *(byte *)((long)puVar33 + 1) & 0xbf;
                                        pjVar53 = (jpc_dec_seg_t *)(ulong)(iVar52 - 1U);
                                        if (1 < iVar52) {
                                          puVar33 = puVar33 + lVar42 * 2;
                                          plVar44 = plVar44 + lVar41;
                                          uVar15 = *puVar33;
                                          if ((uVar15 & 0x5000) == 0) {
                                            bVar24 = jpc_zcctxnolut[uVar15 & 0xff | uVar18];
                                            pjVar20->curctx = pjVar20->ctxs + bVar24;
                                            pjVar9 = pjVar20->ctxs[bVar24];
                                            uVar22 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar22;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar22) {
                                              uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar16 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            if (uVar16 != 0) {
                                              uVar39 = (ulong)(uVar15 >> 4) & 0xff;
                                              bVar24 = jpc_scctxnolut[uVar39];
                                              pjVar20->curctx = pjVar20->ctxs + bVar24;
                                              pjVar9 = pjVar20->ctxs[bVar24];
                                              uVar22 = pjVar9->qeval;
                                              uVar27 = pjVar20->areg - uVar22;
                                              pjVar20->areg = uVar27;
                                              if (pjVar20->creg >> 0x10 < uVar22) {
                                                uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                              }
                                              else {
                                                pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                if ((short)uVar27 < 0) {
                                                  uVar16 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                }
                                              }
                                              bVar55 = uVar16 != jpc_spblut[uVar39];
                                              uVar16 = uVar48;
                                              if (!bVar55) {
                                                uVar16 = uVar47;
                                              }
                                              *plVar44 = (long)(int)uVar16;
                                              *(byte *)(puVar33 + local_a0 * -2 + -2) =
                                                   (byte)puVar33[local_a0 * -2 + -2] | 2;
                                              *(byte *)(puVar33 + local_a0 * -2 + 2) =
                                                   (byte)puVar33[local_a0 * -2 + 2] | 4;
                                              *(byte *)(puVar33 + local_a0 * 2 + -2) =
                                                   (byte)puVar33[local_a0 * 2 + -2] | 1;
                                              *(byte *)(puVar33 + local_a0 * 2 + 2) =
                                                   (byte)puVar33[local_a0 * 2 + 2] | 8;
                                              *(ulong *)(puVar33 + local_a0 * -2) =
                                                   (ulong)bVar55 << 10 |
                                                   *(ulong *)(puVar33 + local_a0 * -2) | 0x40;
                                              *(ulong *)(puVar33 + local_a0 * 2) =
                                                   (ulong)bVar55 << 8 |
                                                   *(ulong *)(puVar33 + local_a0 * 2) | 0x10;
                                              *(ulong *)(puVar33 + -2) =
                                                   (ulong)bVar55 << 9 | *(ulong *)(puVar33 + -2) |
                                                   0x20;
                                              *(ulong *)(puVar33 + 2) =
                                                   (ulong)bVar55 << 0xb | *(ulong *)(puVar33 + 2) |
                                                   0x80;
                                              *(byte *)((long)puVar33 + 1) =
                                                   *(byte *)((long)puVar33 + 1) | 0x10;
                                            }
                                          }
                                          pjVar46 = (jpc_dec_tile_t *)(ulong)uVar15;
                                          *(byte *)((long)puVar33 + 1) =
                                               *(byte *)((long)puVar33 + 1) & 0xbf;
                                          pjVar53 = (jpc_dec_seg_t *)(ulong)(iVar52 - 2U);
                                          if (1 < (int)(iVar52 - 1U)) {
                                            puVar33 = puVar33 + lVar42 * 2;
                                            plVar44 = plVar44 + lVar41;
                                            uVar15 = *puVar33;
                                            if ((uVar15 & 0x5000) == 0) {
                                              bVar24 = jpc_zcctxnolut[uVar15 & 0xff | uVar18];
                                              pjVar20->curctx = pjVar20->ctxs + bVar24;
                                              pjVar9 = pjVar20->ctxs[bVar24];
                                              uVar22 = pjVar9->qeval;
                                              uVar27 = pjVar20->areg - uVar22;
                                              pjVar20->areg = uVar27;
                                              if (pjVar20->creg >> 0x10 < uVar22) {
                                                uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                              }
                                              else {
                                                pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                if ((short)uVar27 < 0) {
                                                  uVar16 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                }
                                              }
                                              if (uVar16 != 0) {
                                                uVar39 = (ulong)(uVar15 >> 4) & 0xff;
                                                bVar24 = jpc_scctxnolut[uVar39];
                                                pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                pjVar9 = pjVar20->ctxs[bVar24];
                                                uVar22 = pjVar9->qeval;
                                                uVar27 = pjVar20->areg - uVar22;
                                                pjVar20->areg = uVar27;
                                                if (pjVar20->creg >> 0x10 < uVar22) {
                                                  uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                }
                                                else {
                                                  pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                  if ((short)uVar27 < 0) {
                                                    uVar16 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                  }
                                                }
                                                bVar55 = uVar16 != jpc_spblut[uVar39];
                                                uVar16 = uVar48;
                                                if (!bVar55) {
                                                  uVar16 = uVar47;
                                                }
                                                *plVar44 = (long)(int)uVar16;
                                                *(byte *)(puVar33 + local_a0 * -2 + -2) =
                                                     (byte)puVar33[local_a0 * -2 + -2] | 2;
                                                *(byte *)(puVar33 + local_a0 * -2 + 2) =
                                                     (byte)puVar33[local_a0 * -2 + 2] | 4;
                                                *(byte *)(puVar33 + local_a0 * 2 + -2) =
                                                     (byte)puVar33[local_a0 * 2 + -2] | 1;
                                                *(byte *)(puVar33 + local_a0 * 2 + 2) =
                                                     (byte)puVar33[local_a0 * 2 + 2] | 8;
                                                *(ulong *)(puVar33 + local_a0 * -2) =
                                                     (ulong)bVar55 << 10 |
                                                     *(ulong *)(puVar33 + local_a0 * -2) | 0x40;
                                                *(ulong *)(puVar33 + local_a0 * 2) =
                                                     (ulong)bVar55 << 8 |
                                                     *(ulong *)(puVar33 + local_a0 * 2) | 0x10;
                                                *(ulong *)(puVar33 + -2) =
                                                     (ulong)bVar55 << 9 | *(ulong *)(puVar33 + -2) |
                                                     0x20;
                                                *(ulong *)(puVar33 + 2) =
                                                     (ulong)bVar55 << 0xb | *(ulong *)(puVar33 + 2)
                                                     | 0x80;
                                                *(byte *)((long)puVar33 + 1) =
                                                     *(byte *)((long)puVar33 + 1) | 0x10;
                                              }
                                            }
                                            pjVar46 = (jpc_dec_tile_t *)(ulong)uVar15;
                                            *(byte *)((long)puVar33 + 1) =
                                                 *(byte *)((long)puVar33 + 1) & 0xbf;
                                            pjVar53 = (jpc_dec_seg_t *)(ulong)(iVar52 - 3U);
                                            if (1 < (int)(iVar52 - 2U)) {
                                              puVar33 = puVar33 + lVar42 * 2;
                                              plVar44 = plVar44 + lVar41;
                                              uVar15 = *puVar33;
                                              if ((uVar15 & 0x5000) == 0) {
                                                bVar24 = jpc_zcctxnolut[uVar15 & 0xff | uVar18];
                                                pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                pjVar9 = pjVar20->ctxs[bVar24];
                                                uVar22 = pjVar9->qeval;
                                                uVar27 = pjVar20->areg - uVar22;
                                                pjVar20->areg = uVar27;
                                                if (pjVar20->creg >> 0x10 < uVar22) {
                                                  uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                }
                                                else {
                                                  pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                  if ((short)uVar27 < 0) {
                                                    uVar16 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                  }
                                                }
                                                if (uVar16 != 0) {
                                                  uVar39 = (ulong)(uVar15 >> 4) & 0xff;
                                                  bVar24 = jpc_scctxnolut[uVar39];
                                                  pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                  pjVar9 = pjVar20->ctxs[bVar24];
                                                  uVar22 = pjVar9->qeval;
                                                  uVar27 = pjVar20->areg - uVar22;
                                                  pjVar20->areg = uVar27;
                                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                                    uVar16 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                  }
                                                  else {
                                                    pjVar20->creg =
                                                         pjVar20->creg + uVar22 * -0x10000;
                                                    if ((short)uVar27 < 0) {
                                                      uVar16 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar16 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                    }
                                                  }
                                                  bVar55 = uVar16 != jpc_spblut[uVar39];
                                                  uVar16 = uVar48;
                                                  if (!bVar55) {
                                                    uVar16 = uVar47;
                                                  }
                                                  *plVar44 = (long)(int)uVar16;
                                                  *(byte *)(puVar33 + local_a0 * -2 + -2) =
                                                       (byte)puVar33[local_a0 * -2 + -2] | 2;
                                                  *(byte *)(puVar33 + local_a0 * -2 + 2) =
                                                       (byte)puVar33[local_a0 * -2 + 2] | 4;
                                                  *(byte *)(puVar33 + local_a0 * 2 + -2) =
                                                       (byte)puVar33[local_a0 * 2 + -2] | 1;
                                                  *(byte *)(puVar33 + local_a0 * 2 + 2) =
                                                       (byte)puVar33[local_a0 * 2 + 2] | 8;
                                                  *(ulong *)(puVar33 + local_a0 * -2) =
                                                       (ulong)bVar55 << 10 |
                                                       *(ulong *)(puVar33 + local_a0 * -2) | 0x40;
                                                  *(ulong *)(puVar33 + local_a0 * 2) =
                                                       (ulong)bVar55 << 8 |
                                                       *(ulong *)(puVar33 + local_a0 * 2) | 0x10;
                                                  *(ulong *)(puVar33 + -2) =
                                                       (ulong)bVar55 << 9 | *(ulong *)(puVar33 + -2)
                                                       | 0x20;
                                                  *(ulong *)(puVar33 + 2) =
                                                       (ulong)bVar55 << 0xb |
                                                       *(ulong *)(puVar33 + 2) | 0x80;
                                                  *(byte *)((long)puVar33 + 1) =
                                                       *(byte *)((long)puVar33 + 1) | 0x10;
                                                }
                                              }
                                              pjVar46 = (jpc_dec_tile_t *)(ulong)uVar15;
                                              pjVar53 = (jpc_dec_seg_t *)(ulong)(iVar52 - 3U);
                                              *(byte *)((long)puVar33 + 1) =
                                                   *(byte *)((long)puVar33 + 1) & 0xbf;
                                            }
                                          }
                                        }
switchD_00128002_caseD_7:
                                        local_100 = local_100 + 1;
                                        lVar51 = lVar51 + 8;
                                        iVar35 = iVar35 + -1;
                                      } while (1 < iVar35);
                                    }
                                    iVar17 = iVar17 + 4;
                                    local_170 = local_170 + iVar28;
                                    pjVar34 = pjVar34 + local_a8 * 4;
                                    local_c8 = local_c8 + iVar28;
                                    local_e0 = local_e0 + iVar28;
                                    local_d8 = local_d8 + iVar28;
                                  } while (iVar17 < iVar13);
                                }
                                if ((bVar3 & 0x20) == 0) {
switchD_00128002_caseD_1:
                                  bVar55 = true;
                                }
                                else {
                                  pjVar20->curctx = pjVar20->ctxs + 0x12;
                                  pjVar9 = pjVar20->ctxs[0x12];
                                  uVar22 = pjVar9->qeval;
                                  uVar27 = pjVar20->areg - uVar22;
                                  pjVar20->areg = uVar27;
                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                    uVar25 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                  }
                                  else {
                                    pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                    if ((short)uVar27 < 0) {
                                      uVar25 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar25 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                    }
                                  }
                                  pjVar9 = *pjVar20->curctx;
                                  uVar22 = pjVar9->qeval;
                                  uVar27 = pjVar20->areg - uVar22;
                                  pjVar20->areg = uVar27;
                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                    uVar47 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                  }
                                  else {
                                    pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                    if ((short)uVar27 < 0) {
                                      uVar47 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar47 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                    }
                                  }
                                  pjVar9 = *pjVar20->curctx;
                                  uVar22 = pjVar9->qeval;
                                  uVar27 = pjVar20->areg - uVar22;
                                  pjVar20->areg = uVar27;
                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                    uVar48 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                  }
                                  else {
                                    pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                    if ((short)uVar27 < 0) {
                                      uVar48 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar48 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                    }
                                  }
                                  pjVar9 = *pjVar20->curctx;
                                  uVar22 = pjVar9->qeval;
                                  uVar27 = pjVar20->areg - uVar22;
                                  pjVar20->areg = uVar27;
                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                    uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                  }
                                  else {
                                    pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                    if ((short)uVar27 < 0) {
                                      uVar18 = (uint)pjVar9->mps;
                                    }
                                    else {
                                      uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                    }
                                  }
                                  bVar55 = true;
                                  if ((uVar18 & 1 |
                                      ((uVar47 & 1) + (uVar25 & 1) * 2) * 4 + (uVar48 & 1) * 2) !=
                                      10) {
                                    jas_eprintf("warning: bad segmentation symbol\n");
                                  }
                                }
                              }
                              else if (uVar37 == 1) {
                                pjVar19 = pjVar50->flags;
                                pjVar8 = pjVar50->data;
                                iVar13 = (int)pjVar8->numcols_;
                                uVar22 = pjVar8->numrows_;
                                if (seg->type == 1) {
                                  if (pjVar19->numrows_ < 2) {
                                    iVar38 = 0;
                                  }
                                  else {
                                    iVar38 = (int)((long)pjVar19->rows_[1] - (long)*pjVar19->rows_
                                                  >> 3);
                                  }
                                  if ((long)uVar22 < 2) {
                                    iVar17 = 0;
                                  }
                                  else {
                                    iVar17 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar55 = true;
                                  if (0 < (int)uVar22) {
                                    pjVar20 = pjVar50->mqdec;
                                    uVar47 = (uint)(1 << (bVar24 & 0x1f)) >> 1;
                                    uVar25 = -(uint)(uVar25 == 0) | -uVar47;
                                    pjVar43 = *pjVar8->rows_;
                                    local_158 = pjVar19->rows_[1];
                                    pjVar34 = local_158 + 1;
                                    lVar42 = (long)iVar38;
                                    iVar38 = iVar38 << 2;
                                    lVar41 = (long)iVar17;
                                    iVar17 = iVar17 << 2;
                                    local_180 = local_158 + lVar42 + 1;
                                    local_120 = local_158 + lVar42 * 2 + 1;
                                    local_158 = local_158 + lVar42 * 3 + 1;
                                    local_100 = pjVar43 + lVar41;
                                    local_108 = pjVar43 + lVar41 * 2;
                                    local_110 = pjVar43 + lVar41 * 3;
                                    do {
                                      iVar28 = (int)uVar22;
                                      if (0 < iVar13) {
                                        lVar42 = 0;
                                        iVar49 = iVar13 + 1;
                                        do {
                                          uVar48 = (uint)*(ulong *)((long)pjVar34 + lVar42);
                                          if ((uVar48 & 0x5000) == 0x1000) {
                                            bVar24 = jpc_magctxnolut
                                                     [(ulong)(uVar48 >> 2 & 0x800) |
                                                      *(ulong *)((long)pjVar34 + lVar42) & 0xff];
                                            pjVar20->curctx = pjVar20->ctxs + bVar24;
                                            pjVar9 = pjVar20->ctxs[bVar24];
                                            uVar22 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar22;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar22) {
                                              uVar48 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar48 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar48 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            uVar18 = uVar25;
                                            if (uVar48 != 0) {
                                              uVar18 = uVar47;
                                            }
                                            uVar48 = -uVar18;
                                            if (-1 < *(long *)((long)pjVar43 + lVar42)) {
                                              uVar48 = uVar18;
                                            }
                                            *(long *)((long)pjVar43 + lVar42) =
                                                 (long)(int)uVar48 +
                                                 *(long *)((long)pjVar43 + lVar42);
                                            pbVar1 = (byte *)((long)pjVar34 + lVar42 + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          if (iVar28 != 1) {
                                            uVar48 = (uint)*(ulong *)((long)local_180 + lVar42);
                                            if ((uVar48 & 0x5000) == 0x1000) {
                                              bVar24 = jpc_magctxnolut
                                                       [(ulong)(uVar48 >> 2 & 0x800) |
                                                        *(ulong *)((long)local_180 + lVar42) & 0xff]
                                              ;
                                              pjVar20->curctx = pjVar20->ctxs + bVar24;
                                              pjVar9 = pjVar20->ctxs[bVar24];
                                              uVar22 = pjVar9->qeval;
                                              uVar27 = pjVar20->areg - uVar22;
                                              pjVar20->areg = uVar27;
                                              if (pjVar20->creg >> 0x10 < uVar22) {
                                                uVar48 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                              }
                                              else {
                                                pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                if ((short)uVar27 < 0) {
                                                  uVar48 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar48 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                }
                                              }
                                              uVar18 = uVar25;
                                              if (uVar48 != 0) {
                                                uVar18 = uVar47;
                                              }
                                              uVar48 = -uVar18;
                                              if (-1 < *(long *)((long)local_100 + lVar42)) {
                                                uVar48 = uVar18;
                                              }
                                              *(long *)((long)local_100 + lVar42) =
                                                   (long)(int)uVar48 +
                                                   *(long *)((long)local_100 + lVar42);
                                              pbVar1 = (byte *)((long)local_180 + lVar42 + 1);
                                              *pbVar1 = *pbVar1 | 0x20;
                                            }
                                            if (2 < iVar28) {
                                              uVar48 = (uint)*(ulong *)((long)local_120 + lVar42);
                                              if ((uVar48 & 0x5000) == 0x1000) {
                                                bVar24 = jpc_magctxnolut
                                                         [(ulong)(uVar48 >> 2 & 0x800) |
                                                          *(ulong *)((long)local_120 + lVar42) &
                                                          0xff];
                                                pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                pjVar9 = pjVar20->ctxs[bVar24];
                                                uVar22 = pjVar9->qeval;
                                                uVar27 = pjVar20->areg - uVar22;
                                                pjVar20->areg = uVar27;
                                                if (pjVar20->creg >> 0x10 < uVar22) {
                                                  uVar48 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                }
                                                else {
                                                  pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                  if ((short)uVar27 < 0) {
                                                    uVar48 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar48 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                  }
                                                }
                                                uVar18 = uVar25;
                                                if (uVar48 != 0) {
                                                  uVar18 = uVar47;
                                                }
                                                uVar48 = -uVar18;
                                                if (-1 < *(long *)((long)local_108 + lVar42)) {
                                                  uVar48 = uVar18;
                                                }
                                                *(long *)((long)local_108 + lVar42) =
                                                     (long)(int)uVar48 +
                                                     *(long *)((long)local_108 + lVar42);
                                                pbVar1 = (byte *)((long)local_120 + lVar42 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                              if (iVar28 != 3) {
                                                uVar48 = (uint)*(ulong *)((long)local_158 + lVar42);
                                                if ((uVar48 & 0x5000) == 0x1000) {
                                                  bVar24 = jpc_magctxnolut
                                                           [(ulong)(uVar48 >> 2 & 0x800) |
                                                            *(ulong *)((long)local_158 + lVar42) &
                                                            0xff];
                                                  pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                  pjVar9 = pjVar20->ctxs[bVar24];
                                                  uVar22 = pjVar9->qeval;
                                                  uVar27 = pjVar20->areg - uVar22;
                                                  pjVar20->areg = uVar27;
                                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                                    uVar48 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                  }
                                                  else {
                                                    pjVar20->creg =
                                                         pjVar20->creg + uVar22 * -0x10000;
                                                    if ((short)uVar27 < 0) {
                                                      uVar48 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar48 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                    }
                                                  }
                                                  uVar18 = uVar25;
                                                  if (uVar48 != 0) {
                                                    uVar18 = uVar47;
                                                  }
                                                  uVar48 = -uVar18;
                                                  if (-1 < *(long *)((long)local_110 + lVar42)) {
                                                    uVar48 = uVar18;
                                                  }
                                                  *(long *)((long)local_110 + lVar42) =
                                                       (long)(int)uVar48 +
                                                       *(long *)((long)local_110 + lVar42);
                                                  pbVar1 = (byte *)((long)local_158 + lVar42 + 1);
                                                  *pbVar1 = *pbVar1 | 0x20;
                                                }
                                              }
                                            }
                                          }
                                          iVar49 = iVar49 + -1;
                                          lVar42 = lVar42 + 8;
                                        } while (1 < iVar49);
                                      }
                                      pjVar34 = pjVar34 + iVar38;
                                      local_180 = local_180 + iVar38;
                                      local_120 = local_120 + iVar38;
                                      local_158 = local_158 + iVar38;
                                      pjVar43 = pjVar43 + iVar17;
                                      local_100 = local_100 + iVar17;
                                      local_108 = local_108 + iVar17;
                                      local_110 = local_110 + iVar17;
                                      uVar22 = (ulong)(iVar28 - 4);
                                      bVar55 = true;
                                    } while (4 < iVar28);
                                  }
                                }
                                else {
                                  if (pjVar19->numrows_ < 2) {
                                    iVar38 = 0;
                                  }
                                  else {
                                    iVar38 = (int)((long)pjVar19->rows_[1] - (long)*pjVar19->rows_
                                                  >> 3);
                                  }
                                  if ((long)uVar22 < 2) {
                                    iVar17 = 0;
                                  }
                                  else {
                                    iVar17 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar55 = true;
                                  if (0 < (int)uVar22) {
                                    pjVar21 = pjVar50->nulldec;
                                    uVar47 = (uint)(1 << (bVar24 & 0x1f)) >> 1;
                                    uVar25 = -(uint)(uVar25 == 0) | -uVar47;
                                    pjVar43 = *pjVar8->rows_;
                                    local_158 = pjVar19->rows_[1];
                                    pjVar34 = local_158 + 1;
                                    lVar42 = (long)iVar38;
                                    iVar38 = iVar38 << 2;
                                    lVar41 = (long)iVar17;
                                    iVar17 = iVar17 << 2;
                                    pjVar45 = local_158 + lVar42 + 1;
                                    local_180 = local_158 + lVar42 * 2 + 1;
                                    local_158 = local_158 + lVar42 * 3 + 1;
                                    local_100 = pjVar43 + lVar41;
                                    local_108 = pjVar43 + lVar41 * 2;
                                    local_110 = pjVar43 + lVar41 * 3;
                                    do {
                                      iVar28 = (int)uVar22;
                                      if (0 < iVar13) {
                                        lVar42 = 0;
                                        iVar49 = iVar13 + 1;
                                        do {
                                          if ((*(uint *)((long)pjVar34 + lVar42) & 0x5000) == 0x1000
                                             ) {
                                            if ((pjVar21->openmode_ & 1) == 0) {
                                              __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2cd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                            }
                                            iVar14 = pjVar21->cnt_;
                                            uVar48 = iVar14 - 1;
                                            pjVar21->cnt_ = uVar48;
                                            if (iVar14 < 1) {
                                              uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                            }
                                            else {
                                              uVar48 = (uint)((pjVar21->buf_ >>
                                                               ((ulong)uVar48 & 0x3f) & 1) != 0);
                                            }
                                            if ((int)uVar48 < 0) goto LAB_00129a05;
                                            uVar18 = uVar25;
                                            if (uVar48 != 0) {
                                              uVar18 = uVar47;
                                            }
                                            lVar41 = -(long)(int)uVar18;
                                            if (-1 < *(long *)((long)pjVar43 + lVar42)) {
                                              lVar41 = (long)(int)uVar18;
                                            }
                                            *(long *)((long)pjVar43 + lVar42) =
                                                 lVar41 + *(long *)((long)pjVar43 + lVar42);
                                            pbVar1 = (byte *)((long)pjVar34 + lVar42 + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          if (iVar28 != 1) {
                                            if ((*(uint *)((long)pjVar45 + lVar42) & 0x5000) ==
                                                0x1000) {
                                              if ((pjVar21->openmode_ & 1) == 0) {
                                                __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ"
                                                              ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2d5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                              }
                                              iVar14 = pjVar21->cnt_;
                                              uVar48 = iVar14 - 1;
                                              pjVar21->cnt_ = uVar48;
                                              if (iVar14 < 1) {
                                                uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                              }
                                              else {
                                                uVar48 = (uint)((pjVar21->buf_ >>
                                                                 ((ulong)uVar48 & 0x3f) & 1) != 0);
                                              }
                                              if ((int)uVar48 < 0) goto LAB_00129a05;
                                              uVar18 = uVar25;
                                              if (uVar48 != 0) {
                                                uVar18 = uVar47;
                                              }
                                              lVar41 = -(long)(int)uVar18;
                                              if (-1 < *(long *)((long)local_100 + lVar42)) {
                                                lVar41 = (long)(int)uVar18;
                                              }
                                              *(long *)((long)local_100 + lVar42) =
                                                   lVar41 + *(long *)((long)local_100 + lVar42);
                                              pbVar1 = (byte *)((long)pjVar45 + lVar42 + 1);
                                              *pbVar1 = *pbVar1 | 0x20;
                                            }
                                            if (2 < iVar28) {
                                              if ((*(uint *)((long)local_180 + lVar42) & 0x5000) ==
                                                  0x1000) {
                                                if ((pjVar21->openmode_ & 1) == 0) {
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2dd,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar14 = pjVar21->cnt_;
                                                uVar48 = iVar14 - 1;
                                                pjVar21->cnt_ = uVar48;
                                                if (iVar14 < 1) {
                                                  uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                }
                                                else {
                                                  uVar48 = (uint)((pjVar21->buf_ >>
                                                                   ((ulong)uVar48 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if ((int)uVar48 < 0) goto LAB_00129a05;
                                                uVar18 = uVar25;
                                                if (uVar48 != 0) {
                                                  uVar18 = uVar47;
                                                }
                                                lVar41 = -(long)(int)uVar18;
                                                if (-1 < *(long *)((long)local_108 + lVar42)) {
                                                  lVar41 = (long)(int)uVar18;
                                                }
                                                *(long *)((long)local_108 + lVar42) =
                                                     lVar41 + *(long *)((long)local_108 + lVar42);
                                                pbVar1 = (byte *)((long)local_180 + lVar42 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                              if ((iVar28 != 3) &&
                                                 ((*(uint *)((long)local_158 + lVar42) & 0x5000) ==
                                                  0x1000)) {
                                                if ((pjVar21->openmode_ & 1) == 0) {
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x2e5,
                                                  "int dec_rawrefpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar14 = pjVar21->cnt_;
                                                uVar48 = iVar14 - 1;
                                                pjVar21->cnt_ = uVar48;
                                                if (iVar14 < 1) {
                                                  uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                }
                                                else {
                                                  uVar48 = (uint)((pjVar21->buf_ >>
                                                                   ((ulong)uVar48 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if ((int)uVar48 < 0) goto LAB_00129a05;
                                                uVar18 = uVar25;
                                                if (uVar48 != 0) {
                                                  uVar18 = uVar47;
                                                }
                                                lVar41 = -(long)(int)uVar18;
                                                if (-1 < *(long *)((long)local_110 + lVar42)) {
                                                  lVar41 = (long)(int)uVar18;
                                                }
                                                *(long *)((long)local_110 + lVar42) =
                                                     lVar41 + *(long *)((long)local_110 + lVar42);
                                                pbVar1 = (byte *)((long)local_158 + lVar42 + 1);
                                                *pbVar1 = *pbVar1 | 0x20;
                                              }
                                            }
                                          }
                                          iVar49 = iVar49 + -1;
                                          lVar42 = lVar42 + 8;
                                        } while (1 < iVar49);
                                      }
                                      pjVar34 = pjVar34 + iVar38;
                                      pjVar45 = pjVar45 + iVar38;
                                      local_180 = local_180 + iVar38;
                                      local_158 = local_158 + iVar38;
                                      pjVar43 = pjVar43 + iVar17;
                                      local_100 = local_100 + iVar17;
                                      local_108 = local_108 + iVar17;
                                      local_110 = local_110 + iVar17;
                                      uVar22 = (ulong)(iVar28 - 4);
                                      bVar55 = true;
                                    } while (4 < iVar28);
                                  }
                                }
                              }
                              else if (uVar37 == 0) {
                                if (seg->type == 1) {
                                  pjVar19 = pjVar50->flags;
                                  if (pjVar19->numrows_ < 2) {
                                    uVar22 = 0;
                                  }
                                  else {
                                    uVar22 = (long)pjVar19->rows_[1] - (long)*pjVar19->rows_ >> 3;
                                  }
                                  pjVar8 = pjVar50->data;
                                  uVar39 = pjVar8->numrows_;
                                  if ((long)uVar39 < 2) {
                                    iVar13 = 0;
                                  }
                                  else {
                                    iVar13 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar55 = true;
                                  if (0 < (int)uVar39) {
                                    bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                    uVar47 = (uint)(1 << (bVar24 & 0x1f)) >> 1 |
                                             1 << (uVar25 & 0x1f);
                                    local_b8 = pjVar19->rows_[1];
                                    uVar40 = uVar22 & 0xffffffff;
                                    lVar42 = (long)(int)uVar22;
                                    pjVar34 = local_b8 + 2;
                                    local_160 = pjVar34 + -uVar40;
                                    local_180 = local_b8 + lVar42 + 2;
                                    local_100 = local_b8 + lVar42 * 2 + 2;
                                    local_168 = local_b8 + lVar42 * 3 + 2;
                                    local_108 = local_b8 + uVar40 + 2;
                                    local_128 = local_b8 + lVar42 + uVar40 + 2;
                                    local_f8 = local_b8 + ((lVar42 + 2) - uVar40);
                                    local_f0 = local_b8 + uVar40 + lVar42 * 2 + 2;
                                    local_d0 = local_b8 + ((lVar42 * 2 + 2) - uVar40);
                                    local_e0 = local_b8 + uVar40 + lVar42 * 3 + 2;
                                    local_b8 = local_b8 + ((lVar42 * 3 + 2) - uVar40);
                                    iVar38 = (int)pjVar8->numcols_;
                                    local_158 = *pjVar8->rows_;
                                    iVar17 = (int)uVar22 * 4;
                                    uVar25 = pjVar36->orient << 8;
                                    uVar48 = -uVar47;
                                    lVar42 = (long)iVar13;
                                    iVar13 = iVar13 << 2;
                                    local_e8 = local_158 + lVar42;
                                    local_d8 = local_158 + lVar42 * 2;
                                    local_c0 = local_158 + lVar42 * 3;
                                    pjVar20 = pjVar50->mqdec;
                                    do {
                                      iVar28 = (int)uVar39;
                                      if (0 < iVar38) {
                                        lVar42 = 0;
                                        iVar49 = iVar38 + 1;
                                        do {
                                          uVar22 = *(ulong *)((long)pjVar34 + lVar42 + -8);
                                          if ((uVar22 & 0x5000) == 0 && (uVar22 & 0xff) != 0) {
                                            bVar24 = jpc_zcctxnolut[(uint)uVar22 & 0xff | uVar25];
                                            pjVar20->curctx = pjVar20->ctxs + bVar24;
                                            pjVar9 = pjVar20->ctxs[bVar24];
                                            uVar39 = pjVar9->qeval;
                                            uVar27 = pjVar20->areg - uVar39;
                                            pjVar20->areg = uVar27;
                                            if (pjVar20->creg >> 0x10 < uVar39) {
                                              uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                            }
                                            else {
                                              pjVar20->creg = pjVar20->creg + uVar39 * -0x10000;
                                              if ((short)uVar27 < 0) {
                                                uVar18 = (uint)pjVar9->mps;
                                              }
                                              else {
                                                uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                              }
                                            }
                                            if (uVar18 != 0) {
                                              uVar39 = uVar22 >> 4 & 0xff;
                                              bVar24 = jpc_scctxnolut[uVar39];
                                              pjVar20->curctx = pjVar20->ctxs + bVar24;
                                              pjVar9 = pjVar20->ctxs[bVar24];
                                              uVar22 = pjVar9->qeval;
                                              uVar27 = pjVar20->areg - uVar22;
                                              pjVar20->areg = uVar27;
                                              if (pjVar20->creg >> 0x10 < uVar22) {
                                                uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                              }
                                              else {
                                                pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                if ((short)uVar27 < 0) {
                                                  uVar18 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                }
                                              }
                                              uVar15 = (uint)jpc_spblut[uVar39];
                                              if ((bVar3 & 8) == 0) {
                                                pbVar1 = (byte *)((long)local_160 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)local_160 + lVar42) =
                                                     *(byte *)((long)local_160 + lVar42) | 4;
                                                pbVar1 = (byte *)((long)local_108 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_108 + lVar42) =
                                                     *(byte *)((long)local_108 + lVar42) | 8;
                                                uVar22 = *(ulong *)((long)local_160 + lVar42 + -8);
                                                if (uVar18 == uVar15) {
                                                  *(ulong *)((long)local_160 + lVar42 + -8) =
                                                       uVar22 | 0x40;
                                                  uVar22 = *(ulong *)((long)local_108 + lVar42 + -8)
                                                  ;
                                                  goto LAB_00128c67;
                                                }
                                                *(ulong *)((long)local_160 + lVar42 + -8) =
                                                     uVar22 | 0x440;
                                                uVar22 = *(ulong *)((long)local_108 + lVar42 + -8);
LAB_00128c99:
                                                uVar22 = uVar22 | 0x110;
                                                uVar39 = 0x880;
                                                uVar40 = 0x220;
                                              }
                                              else {
                                                pbVar1 = (byte *)((long)local_108 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_108 + lVar42) =
                                                     *(byte *)((long)local_108 + lVar42) | 8;
                                                uVar22 = *(ulong *)((long)local_108 + lVar42 + -8);
                                                if (uVar18 != uVar15) goto LAB_00128c99;
LAB_00128c67:
                                                uVar22 = uVar22 | 0x10;
                                                uVar39 = 0x80;
                                                uVar40 = 0x20;
                                              }
                                              *(ulong *)((long)local_108 + lVar42 + -8) = uVar22;
                                              puVar2 = (ulong *)((long)pjVar34 + lVar42 + -0x10);
                                              *puVar2 = *puVar2 | uVar40;
                                              *(ulong *)((long)pjVar34 + lVar42) =
                                                   *(ulong *)((long)pjVar34 + lVar42) | uVar39;
                                              pbVar1 = (byte *)((long)pjVar34 + lVar42 + -7);
                                              *pbVar1 = *pbVar1 | 0x10;
                                              uVar16 = uVar48;
                                              if (uVar18 == uVar15) {
                                                uVar16 = uVar47;
                                              }
                                              *(long *)((long)local_158 + lVar42) =
                                                   (long)(int)uVar16;
                                            }
                                            pbVar1 = (byte *)((long)pjVar34 + lVar42 + -7);
                                            *pbVar1 = *pbVar1 | 0x40;
                                          }
                                          if (iVar28 != 1) {
                                            uVar22 = *(ulong *)((long)local_180 + lVar42 + -8);
                                            if ((uVar22 & 0x5000) == 0 && (uVar22 & 0xff) != 0) {
                                              bVar24 = jpc_zcctxnolut[(uint)uVar22 & 0xff | uVar25];
                                              pjVar20->curctx = pjVar20->ctxs + bVar24;
                                              pjVar9 = pjVar20->ctxs[bVar24];
                                              uVar39 = pjVar9->qeval;
                                              uVar27 = pjVar20->areg - uVar39;
                                              pjVar20->areg = uVar27;
                                              if (pjVar20->creg >> 0x10 < uVar39) {
                                                uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                              }
                                              else {
                                                pjVar20->creg = pjVar20->creg + uVar39 * -0x10000;
                                                if ((short)uVar27 < 0) {
                                                  uVar18 = (uint)pjVar9->mps;
                                                }
                                                else {
                                                  uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                }
                                              }
                                              if (uVar18 != 0) {
                                                uVar39 = uVar22 >> 4 & 0xff;
                                                bVar24 = jpc_scctxnolut[uVar39];
                                                pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                pjVar9 = pjVar20->ctxs[bVar24];
                                                uVar22 = pjVar9->qeval;
                                                uVar27 = pjVar20->areg - uVar22;
                                                pjVar20->areg = uVar27;
                                                if (pjVar20->creg >> 0x10 < uVar22) {
                                                  uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                }
                                                else {
                                                  pjVar20->creg = pjVar20->creg + uVar22 * -0x10000;
                                                  if ((short)uVar27 < 0) {
                                                    uVar18 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                  }
                                                }
                                                _Var4 = jpc_spblut[uVar39];
                                                puVar2 = (ulong *)((long)local_f8 + lVar42 + -0x10);
                                                *puVar2 = *puVar2 | 2;
                                                *(byte *)((long)local_f8 + lVar42) =
                                                     *(byte *)((long)local_f8 + lVar42) | 4;
                                                pbVar1 = (byte *)((long)local_128 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_128 + lVar42) =
                                                     *(byte *)((long)local_128 + lVar42) | 8;
                                                bVar54 = uVar18 != _Var4;
                                                uVar18 = uVar48;
                                                if (!bVar54) {
                                                  uVar18 = uVar47;
                                                }
                                                *(ulong *)((long)local_f8 + lVar42 + -8) =
                                                     (ulong)bVar54 << 10 |
                                                     *(ulong *)((long)local_f8 + lVar42 + -8) | 0x40
                                                ;
                                                *(ulong *)((long)local_128 + lVar42 + -8) =
                                                     (ulong)bVar54 << 8 |
                                                     *(ulong *)((long)local_128 + lVar42 + -8) |
                                                     0x10;
                                                *(ulong *)((long)local_180 + lVar42 + -0x10) =
                                                     (ulong)bVar54 << 9 |
                                                     *(ulong *)((long)local_180 + lVar42 + -0x10) |
                                                     0x20;
                                                *(ulong *)((long)local_180 + lVar42) =
                                                     (ulong)bVar54 << 0xb |
                                                     *(ulong *)((long)local_180 + lVar42) | 0x80;
                                                pbVar1 = (byte *)((long)local_180 + lVar42 + -7);
                                                *pbVar1 = *pbVar1 | 0x10;
                                                *(long *)((long)local_e8 + lVar42) =
                                                     (long)(int)uVar18;
                                              }
                                              pbVar1 = (byte *)((long)local_180 + lVar42 + -7);
                                              *pbVar1 = *pbVar1 | 0x40;
                                            }
                                            if (2 < iVar28) {
                                              uVar22 = *(ulong *)((long)local_100 + lVar42 + -8);
                                              if ((uVar22 & 0x5000) == 0 && (uVar22 & 0xff) != 0) {
                                                bVar24 = jpc_zcctxnolut
                                                         [(uint)uVar22 & 0xff | uVar25];
                                                pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                pjVar9 = pjVar20->ctxs[bVar24];
                                                uVar39 = pjVar9->qeval;
                                                uVar27 = pjVar20->areg - uVar39;
                                                pjVar20->areg = uVar27;
                                                if (pjVar20->creg >> 0x10 < uVar39) {
                                                  uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                }
                                                else {
                                                  pjVar20->creg = pjVar20->creg + uVar39 * -0x10000;
                                                  if ((short)uVar27 < 0) {
                                                    uVar18 = (uint)pjVar9->mps;
                                                  }
                                                  else {
                                                    uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                  }
                                                }
                                                if (uVar18 != 0) {
                                                  uVar39 = uVar22 >> 4 & 0xff;
                                                  bVar24 = jpc_scctxnolut[uVar39];
                                                  pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                  pjVar9 = pjVar20->ctxs[bVar24];
                                                  uVar22 = pjVar9->qeval;
                                                  uVar27 = pjVar20->areg - uVar22;
                                                  pjVar20->areg = uVar27;
                                                  if (pjVar20->creg >> 0x10 < uVar22) {
                                                    uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                  }
                                                  else {
                                                    pjVar20->creg =
                                                         pjVar20->creg + uVar22 * -0x10000;
                                                    if ((short)uVar27 < 0) {
                                                      uVar18 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                    }
                                                  }
                                                  _Var4 = jpc_spblut[uVar39];
                                                  puVar2 = (ulong *)((long)local_d0 + lVar42 + -0x10
                                                                    );
                                                  *puVar2 = *puVar2 | 2;
                                                  *(byte *)((long)local_d0 + lVar42) =
                                                       *(byte *)((long)local_d0 + lVar42) | 4;
                                                  pbVar1 = (byte *)((long)local_f0 + lVar42 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_f0 + lVar42) =
                                                       *(byte *)((long)local_f0 + lVar42) | 8;
                                                  bVar54 = uVar18 != _Var4;
                                                  uVar18 = uVar48;
                                                  if (!bVar54) {
                                                    uVar18 = uVar47;
                                                  }
                                                  *(ulong *)((long)local_d0 + lVar42 + -8) =
                                                       (ulong)bVar54 << 10 |
                                                       *(ulong *)((long)local_d0 + lVar42 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_f0 + lVar42 + -8) =
                                                       (ulong)bVar54 << 8 |
                                                       *(ulong *)((long)local_f0 + lVar42 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_100 + lVar42 + -0x10) =
                                                       (ulong)bVar54 << 9 |
                                                       *(ulong *)((long)local_100 + lVar42 + -0x10)
                                                       | 0x20;
                                                  *(ulong *)((long)local_100 + lVar42) =
                                                       (ulong)bVar54 << 0xb |
                                                       *(ulong *)((long)local_100 + lVar42) | 0x80;
                                                  pbVar1 = (byte *)((long)local_100 + lVar42 + -7);
                                                  *pbVar1 = *pbVar1 | 0x10;
                                                  *(long *)((long)local_d8 + lVar42) =
                                                       (long)(int)uVar18;
                                                }
                                                pbVar1 = (byte *)((long)local_100 + lVar42 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                              if (iVar28 != 3) {
                                                uVar22 = *(ulong *)((long)local_168 + lVar42 + -8);
                                                if ((uVar22 & 0x5000) == 0 && (uVar22 & 0xff) != 0)
                                                {
                                                  bVar24 = jpc_zcctxnolut
                                                           [(uint)uVar22 & 0xff | uVar25];
                                                  pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                  pjVar9 = pjVar20->ctxs[bVar24];
                                                  uVar39 = pjVar9->qeval;
                                                  uVar27 = pjVar20->areg - uVar39;
                                                  pjVar20->areg = uVar27;
                                                  if (pjVar20->creg >> 0x10 < uVar39) {
                                                    uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                  }
                                                  else {
                                                    pjVar20->creg =
                                                         pjVar20->creg + uVar39 * -0x10000;
                                                    if ((short)uVar27 < 0) {
                                                      uVar18 = (uint)pjVar9->mps;
                                                    }
                                                    else {
                                                      uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                    }
                                                  }
                                                  if (uVar18 != 0) {
                                                    uVar39 = uVar22 >> 4 & 0xff;
                                                    bVar24 = jpc_scctxnolut[uVar39];
                                                    pjVar20->curctx = pjVar20->ctxs + bVar24;
                                                    pjVar9 = pjVar20->ctxs[bVar24];
                                                    uVar22 = pjVar9->qeval;
                                                    uVar27 = pjVar20->areg - uVar22;
                                                    pjVar20->areg = uVar27;
                                                    if (pjVar20->creg >> 0x10 < uVar22) {
                                                      uVar18 = jpc_mqdec_lpsexchrenormd(pjVar20);
                                                    }
                                                    else {
                                                      pjVar20->creg =
                                                           pjVar20->creg + uVar22 * -0x10000;
                                                      if ((short)uVar27 < 0) {
                                                        uVar18 = (uint)pjVar9->mps;
                                                      }
                                                      else {
                                                        uVar18 = jpc_mqdec_mpsexchrenormd(pjVar20);
                                                      }
                                                    }
                                                    _Var4 = jpc_spblut[uVar39];
                                                    puVar2 = (ulong *)((long)local_b8 +
                                                                      lVar42 + -0x10);
                                                    *puVar2 = *puVar2 | 2;
                                                    *(byte *)((long)local_b8 + lVar42) =
                                                         *(byte *)((long)local_b8 + lVar42) | 4;
                                                    pbVar1 = (byte *)((long)local_e0 +
                                                                     lVar42 + -0x10);
                                                    *pbVar1 = *pbVar1 | 1;
                                                    *(byte *)((long)local_e0 + lVar42) =
                                                         *(byte *)((long)local_e0 + lVar42) | 8;
                                                    bVar54 = uVar18 != _Var4;
                                                    uVar18 = uVar48;
                                                    if (!bVar54) {
                                                      uVar18 = uVar47;
                                                    }
                                                    *(ulong *)((long)local_b8 + lVar42 + -8) =
                                                         (ulong)bVar54 << 10 |
                                                         *(ulong *)((long)local_b8 + lVar42 + -8) |
                                                         0x40;
                                                    *(ulong *)((long)local_e0 + lVar42 + -8) =
                                                         (ulong)bVar54 << 8 |
                                                         *(ulong *)((long)local_e0 + lVar42 + -8) |
                                                         0x10;
                                                    *(ulong *)((long)local_168 + lVar42 + -0x10) =
                                                         (ulong)bVar54 << 9 |
                                                         *(ulong *)((long)local_168 + lVar42 + -0x10
                                                                   ) | 0x20;
                                                    *(ulong *)((long)local_168 + lVar42) =
                                                         (ulong)bVar54 << 0xb |
                                                         *(ulong *)((long)local_168 + lVar42) | 0x80
                                                    ;
                                                    pbVar1 = (byte *)((long)local_168 + lVar42 + -7)
                                                    ;
                                                    *pbVar1 = *pbVar1 | 0x10;
                                                    *(long *)((long)local_c0 + lVar42) =
                                                         (long)(int)uVar18;
                                                  }
                                                  pbVar1 = (byte *)((long)local_168 + lVar42 + -7);
                                                  *pbVar1 = *pbVar1 | 0x40;
                                                }
                                              }
                                            }
                                          }
                                          iVar49 = iVar49 + -1;
                                          lVar42 = lVar42 + 8;
                                        } while (1 < iVar49);
                                      }
                                      local_158 = local_158 + iVar13;
                                      local_e8 = local_e8 + iVar13;
                                      local_d8 = local_d8 + iVar13;
                                      local_c0 = local_c0 + iVar13;
                                      pjVar34 = pjVar34 + iVar17;
                                      local_108 = local_108 + iVar17;
                                      local_160 = local_160 + iVar17;
                                      local_180 = local_180 + iVar17;
                                      local_128 = local_128 + iVar17;
                                      local_f8 = local_f8 + iVar17;
                                      local_100 = local_100 + iVar17;
                                      local_f0 = local_f0 + iVar17;
                                      local_d0 = local_d0 + iVar17;
                                      local_168 = local_168 + iVar17;
                                      local_e0 = local_e0 + iVar17;
                                      local_b8 = local_b8 + iVar17;
                                      uVar39 = (ulong)(iVar28 - 4);
                                    } while (4 < iVar28);
                                  }
                                }
                                else {
                                  pjVar19 = pjVar50->flags;
                                  if (pjVar19->numrows_ < 2) {
                                    uVar22 = 0;
                                  }
                                  else {
                                    uVar22 = (long)pjVar19->rows_[1] - (long)*pjVar19->rows_ >> 3;
                                  }
                                  pjVar8 = pjVar50->data;
                                  uVar39 = pjVar8->numrows_;
                                  if ((long)uVar39 < 2) {
                                    iVar13 = 0;
                                  }
                                  else {
                                    iVar13 = (int)((long)pjVar8->rows_[1] - (long)*pjVar8->rows_ >>
                                                  3);
                                  }
                                  bVar55 = true;
                                  if (0 < (int)uVar39) {
                                    bVar3 = tile->cp->ccps[iVar30].cblkctx;
                                    uVar47 = (uint)(1 << (bVar24 & 0x1f)) >> 1 |
                                             1 << (uVar25 & 0x1f);
                                    local_d8 = pjVar19->rows_[1];
                                    uVar40 = uVar22 & 0xffffffff;
                                    lVar42 = (long)(int)uVar22;
                                    pjVar34 = local_d8 + 2;
                                    local_100 = pjVar34 + -uVar40;
                                    pjVar45 = local_d8 + lVar42 + 2;
                                    local_120 = local_d8 + lVar42 * 2 + 2;
                                    local_110 = local_d8 + lVar42 * 3 + 2;
                                    pjVar43 = local_d8 + uVar40 + 2;
                                    local_168 = local_d8 + lVar42 + uVar40 + 2;
                                    local_160 = local_d8 + ((lVar42 + 2) - uVar40);
                                    local_f8 = local_d8 + uVar40 + lVar42 * 2 + 2;
                                    local_e8 = local_d8 + ((lVar42 * 2 + 2) - uVar40);
                                    local_d0 = local_d8 + uVar40 + lVar42 * 3 + 2;
                                    local_d8 = local_d8 + ((lVar42 * 3 + 2) - uVar40);
                                    iVar38 = (int)pjVar8->numcols_;
                                    local_158 = *pjVar8->rows_;
                                    iVar17 = (int)uVar22 * 4;
                                    uVar25 = -uVar47;
                                    lVar42 = (long)iVar13;
                                    iVar13 = iVar13 << 2;
                                    local_128 = local_158 + lVar42;
                                    local_f0 = local_158 + lVar42 * 2;
                                    local_e0 = local_158 + lVar42 * 3;
                                    pjVar21 = pjVar50->nulldec;
                                    do {
                                      iVar28 = (int)uVar39;
                                      if (0 < iVar38) {
                                        lVar42 = 0;
                                        iVar49 = iVar38 + 1;
                                        do {
                                          uVar22 = *(ulong *)((long)pjVar34 + lVar42 + -8);
                                          if ((uVar22 & 0x5000) == 0 && (char)uVar22 != '\0') {
                                            if ((pjVar21->openmode_ & 1) == 0) {
LAB_00129d83:
                                              __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x204,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                            }
                                            iVar14 = pjVar21->cnt_;
                                            uVar48 = iVar14 - 1;
                                            pjVar21->cnt_ = uVar48;
                                            if (iVar14 < 1) {
                                              uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                            }
                                            else {
                                              uVar48 = (uint)((pjVar21->buf_ >>
                                                               ((ulong)uVar48 & 0x3f) & 1) != 0);
                                            }
                                            if ((int)uVar48 < 0) goto LAB_00129a05;
                                            if (uVar48 != 0) {
                                              if ((pjVar21->openmode_ & 1) == 0) goto LAB_00129d83;
                                              iVar14 = pjVar21->cnt_;
                                              uVar48 = iVar14 - 1;
                                              pjVar21->cnt_ = uVar48;
                                              if (iVar14 < 1) {
                                                uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                              }
                                              else {
                                                uVar48 = (uint)((pjVar21->buf_ >>
                                                                 ((ulong)uVar48 & 0x3f) & 1) != 0);
                                              }
                                              if ((int)uVar48 < 0) goto LAB_00129a05;
                                              if ((bVar3 & 8) == 0) {
                                                pbVar1 = (byte *)((long)local_100 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)local_100 + lVar42) =
                                                     *(byte *)((long)local_100 + lVar42) | 4;
                                                pbVar1 = (byte *)((long)pjVar43 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)pjVar43 + lVar42) =
                                                     *(byte *)((long)pjVar43 + lVar42) | 8;
                                                uVar22 = *(ulong *)((long)local_100 + lVar42 + -8);
                                                if (uVar48 != 0) {
                                                  *(ulong *)((long)local_100 + lVar42 + -8) =
                                                       uVar22 | 0x440;
                                                  uVar22 = *(ulong *)((long)pjVar43 + lVar42 + -8);
                                                  goto LAB_00129534;
                                                }
                                                *(ulong *)((long)local_100 + lVar42 + -8) =
                                                     uVar22 | 0x40;
                                                uVar22 = *(ulong *)((long)pjVar43 + lVar42 + -8);
LAB_0012954e:
                                                uVar22 = uVar22 | 0x10;
                                                uVar39 = 0x80;
                                                uVar40 = 0x20;
                                              }
                                              else {
                                                pbVar1 = (byte *)((long)pjVar43 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)pjVar43 + lVar42) =
                                                     *(byte *)((long)pjVar43 + lVar42) | 8;
                                                uVar22 = *(ulong *)((long)pjVar43 + lVar42 + -8);
                                                if (uVar48 == 0) goto LAB_0012954e;
LAB_00129534:
                                                uVar22 = uVar22 | 0x110;
                                                uVar39 = 0x880;
                                                uVar40 = 0x220;
                                              }
                                              *(ulong *)((long)pjVar43 + lVar42 + -8) = uVar22;
                                              puVar2 = (ulong *)((long)pjVar34 + lVar42 + -0x10);
                                              *puVar2 = *puVar2 | uVar40;
                                              *(ulong *)((long)pjVar34 + lVar42) =
                                                   *(ulong *)((long)pjVar34 + lVar42) | uVar39;
                                              pbVar1 = (byte *)((long)pjVar34 + lVar42 + -7);
                                              *pbVar1 = *pbVar1 | 0x10;
                                              uVar18 = uVar25;
                                              if (uVar48 == 0) {
                                                uVar18 = uVar47;
                                              }
                                              *(long *)((long)local_158 + lVar42) =
                                                   (long)(int)uVar18;
                                            }
                                            pbVar1 = (byte *)((long)pjVar34 + lVar42 + -7);
                                            *pbVar1 = *pbVar1 | 0x40;
                                          }
                                          if (iVar28 != 1) {
                                            uVar22 = *(ulong *)((long)pjVar45 + lVar42 + -8);
                                            if ((uVar22 & 0x5000) == 0 && (char)uVar22 != '\0') {
                                              if ((pjVar21->openmode_ & 1) == 0) {
LAB_00129de0:
                                                __assert_fail("(in)->openmode_ & JPC_BITSTREAM_READ"
                                                              ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x20d,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                              }
                                              iVar14 = pjVar21->cnt_;
                                              uVar48 = iVar14 - 1;
                                              pjVar21->cnt_ = uVar48;
                                              if (iVar14 < 1) {
                                                uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                              }
                                              else {
                                                uVar48 = (uint)((pjVar21->buf_ >>
                                                                 ((ulong)uVar48 & 0x3f) & 1) != 0);
                                              }
                                              if ((int)uVar48 < 0) goto LAB_00129a05;
                                              if (uVar48 != 0) {
                                                if ((pjVar21->openmode_ & 1) == 0)
                                                goto LAB_00129de0;
                                                iVar14 = pjVar21->cnt_;
                                                uVar48 = iVar14 - 1;
                                                pjVar21->cnt_ = uVar48;
                                                if (iVar14 < 1) {
                                                  uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                }
                                                else {
                                                  uVar48 = (uint)((pjVar21->buf_ >>
                                                                   ((ulong)uVar48 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if ((int)uVar48 < 0) goto LAB_00129a05;
                                                pbVar1 = (byte *)((long)local_160 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 2;
                                                *(byte *)((long)local_160 + lVar42) =
                                                     *(byte *)((long)local_160 + lVar42) | 4;
                                                pbVar1 = (byte *)((long)local_168 + lVar42 + -0x10);
                                                *pbVar1 = *pbVar1 | 1;
                                                *(byte *)((long)local_168 + lVar42) =
                                                     *(byte *)((long)local_168 + lVar42) | 8;
                                                bVar54 = uVar48 != 0;
                                                uVar48 = uVar25;
                                                if (!bVar54) {
                                                  uVar48 = uVar47;
                                                }
                                                *(ulong *)((long)local_160 + lVar42 + -8) =
                                                     (ulong)bVar54 << 10 |
                                                     *(ulong *)((long)local_160 + lVar42 + -8) |
                                                     0x40;
                                                *(ulong *)((long)local_168 + lVar42 + -8) =
                                                     (ulong)bVar54 << 8 |
                                                     *(ulong *)((long)local_168 + lVar42 + -8) |
                                                     0x10;
                                                *(ulong *)((long)pjVar45 + lVar42 + -0x10) =
                                                     (ulong)bVar54 << 9 |
                                                     *(ulong *)((long)pjVar45 + lVar42 + -0x10) |
                                                     0x20;
                                                *(ulong *)((long)pjVar45 + lVar42) =
                                                     (ulong)bVar54 << 0xb |
                                                     *(ulong *)((long)pjVar45 + lVar42) | 0x80;
                                                pbVar1 = (byte *)((long)pjVar45 + lVar42 + -7);
                                                *pbVar1 = *pbVar1 | 0x10;
                                                *(long *)((long)local_128 + lVar42) =
                                                     (long)(int)uVar48;
                                              }
                                              pbVar1 = (byte *)((long)pjVar45 + lVar42 + -7);
                                              *pbVar1 = *pbVar1 | 0x40;
                                            }
                                            if (2 < iVar28) {
                                              uVar22 = *(ulong *)((long)local_120 + lVar42 + -8);
                                              if ((uVar22 & 0x5000) == 0 && (char)uVar22 != '\0') {
                                                if ((pjVar21->openmode_ & 1) == 0) {
LAB_00129e1e:
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x216,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar14 = pjVar21->cnt_;
                                                uVar48 = iVar14 - 1;
                                                pjVar21->cnt_ = uVar48;
                                                if (iVar14 < 1) {
                                                  uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                }
                                                else {
                                                  uVar48 = (uint)((pjVar21->buf_ >>
                                                                   ((ulong)uVar48 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if ((int)uVar48 < 0) goto LAB_00129a05;
                                                if (uVar48 != 0) {
                                                  if ((pjVar21->openmode_ & 1) == 0)
                                                  goto LAB_00129e1e;
                                                  iVar14 = pjVar21->cnt_;
                                                  uVar48 = iVar14 - 1;
                                                  pjVar21->cnt_ = uVar48;
                                                  if (iVar14 < 1) {
                                                    uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                  }
                                                  else {
                                                    uVar48 = (uint)((pjVar21->buf_ >>
                                                                     ((ulong)uVar48 & 0x3f) & 1) !=
                                                                   0);
                                                  }
                                                  if ((int)uVar48 < 0) goto LAB_00129a05;
                                                  pbVar1 = (byte *)((long)local_e8 + lVar42 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 2;
                                                  *(byte *)((long)local_e8 + lVar42) =
                                                       *(byte *)((long)local_e8 + lVar42) | 4;
                                                  pbVar1 = (byte *)((long)local_f8 + lVar42 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_f8 + lVar42) =
                                                       *(byte *)((long)local_f8 + lVar42) | 8;
                                                  bVar54 = uVar48 != 0;
                                                  uVar48 = uVar25;
                                                  if (!bVar54) {
                                                    uVar48 = uVar47;
                                                  }
                                                  *(ulong *)((long)local_e8 + lVar42 + -8) =
                                                       (ulong)bVar54 << 10 |
                                                       *(ulong *)((long)local_e8 + lVar42 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_f8 + lVar42 + -8) =
                                                       (ulong)bVar54 << 8 |
                                                       *(ulong *)((long)local_f8 + lVar42 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_120 + lVar42 + -0x10) =
                                                       (ulong)bVar54 << 9 |
                                                       *(ulong *)((long)local_120 + lVar42 + -0x10)
                                                       | 0x20;
                                                  *(ulong *)((long)local_120 + lVar42) =
                                                       (ulong)bVar54 << 0xb |
                                                       *(ulong *)((long)local_120 + lVar42) | 0x80;
                                                  pbVar1 = (byte *)((long)local_120 + lVar42 + -7);
                                                  *pbVar1 = *pbVar1 | 0x10;
                                                  *(long *)((long)local_f0 + lVar42) =
                                                       (long)(int)uVar48;
                                                }
                                                pbVar1 = (byte *)((long)local_120 + lVar42 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                              if ((iVar28 != 3) &&
                                                 (uVar22 = *(ulong *)((long)local_110 + lVar42 + -8)
                                                 , (uVar22 & 0x5000) == 0 && (char)uVar22 != '\0'))
                                              {
                                                if ((pjVar21->openmode_ & 1) == 0) {
LAB_00129eb9:
                                                  __assert_fail(
                                                  "(in)->openmode_ & JPC_BITSTREAM_READ",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                                  ,0x21f,
                                                  "int dec_rawsigpass(jpc_dec_t *, jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *)"
                                                  );
                                                }
                                                iVar14 = pjVar21->cnt_;
                                                uVar48 = iVar14 - 1;
                                                pjVar21->cnt_ = uVar48;
                                                if (iVar14 < 1) {
                                                  uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                }
                                                else {
                                                  uVar48 = (uint)((pjVar21->buf_ >>
                                                                   ((ulong)uVar48 & 0x3f) & 1) != 0)
                                                  ;
                                                }
                                                if ((int)uVar48 < 0) goto LAB_00129a05;
                                                if (uVar48 != 0) {
                                                  if ((pjVar21->openmode_ & 1) == 0)
                                                  goto LAB_00129eb9;
                                                  iVar14 = pjVar21->cnt_;
                                                  uVar48 = iVar14 - 1;
                                                  pjVar21->cnt_ = uVar48;
                                                  if (iVar14 < 1) {
                                                    uVar48 = jpc_bitstream_fillbuf(pjVar21);
                                                  }
                                                  else {
                                                    uVar48 = (uint)((pjVar21->buf_ >>
                                                                     ((ulong)uVar48 & 0x3f) & 1) !=
                                                                   0);
                                                  }
                                                  if ((int)uVar48 < 0) goto LAB_00129a05;
                                                  pbVar1 = (byte *)((long)local_d8 + lVar42 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 2;
                                                  *(byte *)((long)local_d8 + lVar42) =
                                                       *(byte *)((long)local_d8 + lVar42) | 4;
                                                  pbVar1 = (byte *)((long)local_d0 + lVar42 + -0x10)
                                                  ;
                                                  *pbVar1 = *pbVar1 | 1;
                                                  *(byte *)((long)local_d0 + lVar42) =
                                                       *(byte *)((long)local_d0 + lVar42) | 8;
                                                  bVar54 = uVar48 != 0;
                                                  uVar48 = uVar25;
                                                  if (!bVar54) {
                                                    uVar48 = uVar47;
                                                  }
                                                  *(ulong *)((long)local_d8 + lVar42 + -8) =
                                                       (ulong)bVar54 << 10 |
                                                       *(ulong *)((long)local_d8 + lVar42 + -8) |
                                                       0x40;
                                                  *(ulong *)((long)local_d0 + lVar42 + -8) =
                                                       (ulong)bVar54 << 8 |
                                                       *(ulong *)((long)local_d0 + lVar42 + -8) |
                                                       0x10;
                                                  *(ulong *)((long)local_110 + lVar42 + -0x10) =
                                                       (ulong)bVar54 << 9 |
                                                       *(ulong *)((long)local_110 + lVar42 + -0x10)
                                                       | 0x20;
                                                  *(ulong *)((long)local_110 + lVar42) =
                                                       (ulong)bVar54 << 0xb |
                                                       *(ulong *)((long)local_110 + lVar42) | 0x80;
                                                  pbVar1 = (byte *)((long)local_110 + lVar42 + -7);
                                                  *pbVar1 = *pbVar1 | 0x10;
                                                  *(long *)((long)local_e0 + lVar42) =
                                                       (long)(int)uVar48;
                                                }
                                                pbVar1 = (byte *)((long)local_110 + lVar42 + -7);
                                                *pbVar1 = *pbVar1 | 0x40;
                                              }
                                            }
                                          }
                                          iVar49 = iVar49 + -1;
                                          lVar42 = lVar42 + 8;
                                        } while (1 < iVar49);
                                      }
                                      local_158 = local_158 + iVar13;
                                      local_128 = local_128 + iVar13;
                                      local_f0 = local_f0 + iVar13;
                                      local_e0 = local_e0 + iVar13;
                                      pjVar34 = pjVar34 + iVar17;
                                      pjVar43 = pjVar43 + iVar17;
                                      local_100 = local_100 + iVar17;
                                      pjVar45 = pjVar45 + iVar17;
                                      local_168 = local_168 + iVar17;
                                      local_160 = local_160 + iVar17;
                                      local_120 = local_120 + iVar17;
                                      local_f8 = local_f8 + iVar17;
                                      local_e8 = local_e8 + iVar17;
                                      local_110 = local_110 + iVar17;
                                      local_d0 = local_d0 + iVar17;
                                      local_d8 = local_d8 + iVar17;
                                      uVar39 = (ulong)(iVar28 - 4);
                                    } while (4 < iVar28);
                                  }
                                }
                              }
                              else {
                                bVar55 = false;
                              }
                              goto LAB_00129a2a;
                            }
                            goto LAB_00129cbb;
                          }
LAB_00129c13:
                          if (seg->type != 1) {
                            if (seg->type != 2) {
                              __assert_fail("seg->type == JPC_SEG_RAW",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                            ,0x131,
                                            "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                           );
                            }
                            bVar55 = (tile->cp->ccps[iVar30].cblkctx & 0x10) == 0;
                            iVar31 = 0x2a;
                            if (bVar55) {
                              iVar31 = 0;
                            }
                            iVar13 = 0x7f;
                            if (bVar55) {
                              iVar13 = 0;
                            }
                            iVar31 = jpc_bitstream_inalign(pjVar50->nulldec,iVar13,iVar31);
                            if (iVar31 < 0) {
                              return -1;
                            }
                            if (iVar31 != 0) {
                              jas_eprintf("warning: bad termination pattern detected\n");
                            }
                            jpc_bitstream_close(pjVar50->nulldec);
                            pjVar50->nulldec = (jpc_bitstream_t *)0x0;
                          }
                          pjVar50->curseg = seg->next;
                          jpc_seglist_remove(&pjVar50->segs,seg);
                          jpc_seg_destroy(seg);
                          seg = pjVar50->curseg;
                          if (seg == (jpc_dec_seg_t *)0x0) break;
                        }
                      }
                      if (pjVar50->curseg != (jpc_dec_seg_t *)0x0) {
                        __assert_fail("dopartial ? (!cblk->curseg) : 1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1dec.c"
                                      ,0x149,
                                      "int jpc_dec_decodecblk(jpc_dec_t *, jpc_dec_tile_t *, jpc_dec_tcomp_t *, jpc_dec_band_t *, jpc_dec_cblk_t *, int, int)"
                                     );
                      }
LAB_00129cbb:
                      pjVar50 = pjVar50 + 1;
                      bVar55 = 1 < iVar6;
                      iVar6 = iVar6 + -1;
                    } while (bVar55);
                  }
                  pjVar26 = pjVar26 + 1;
                  bVar55 = 1 < iVar12;
                  iVar12 = iVar12 + -1;
                } while (bVar55);
              }
              pjVar36 = pjVar36 + 1;
              bVar55 = 1 < iVar5;
              iVar5 = iVar5 + -1;
            } while (bVar55);
          }
          pjVar29 = pjVar29 + 1;
          bVar55 = 1 < (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar55);
      }
      pjVar32 = pjVar32 + 1;
      bVar55 = 1 < iVar10;
      iVar10 = iVar10 + -1;
    } while (bVar55);
  }
  return 0;
LAB_00129a05:
  bVar55 = false;
LAB_00129a2a:
  if ((tile->cp->ccps[iVar30].cblkctx & 2) != 0) {
    jpc_mqdec_setctxs(pjVar50->mqdec,0x13,jpc_mqctxs);
  }
  if (!bVar55) {
    jas_eprintf("coding pass failed passtype=%d segtype=%d\n",(ulong)uVar37,(ulong)(uint)seg->type);
    return -1;
  }
  iVar31 = iVar31 + 1;
  if (seg->numpasses <= iVar31) goto LAB_00129c13;
  goto LAB_0012713b;
}

Assistant:

int jpc_dec_decodecblks(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compcnt;
	jpc_dec_rlvl_t *rlvl;
	int rlvlcnt;
	jpc_dec_band_t *band;
	int bandcnt;
	jpc_dec_prc_t *prc;
	int prccnt;
	jpc_dec_cblk_t *cblk;
	int cblkcnt;

	for (compcnt = dec->numcomps, tcomp = tile->tcomps; compcnt > 0;
	  --compcnt, ++tcomp) {
		for (rlvlcnt = tcomp->numrlvls, rlvl = tcomp->rlvls;
		  rlvlcnt > 0; --rlvlcnt, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandcnt = rlvl->numbands, band = rlvl->bands;
			  bandcnt > 0; --bandcnt, ++band) {
				if (!band->data) {
					continue;
				}
				for (prccnt = rlvl->numprcs, prc = band->prcs;
				  prccnt > 0; --prccnt, ++prc) {
					if (!prc->cblks) {
						continue;
					}
					for (cblkcnt = prc->numcblks,
					  cblk = prc->cblks; cblkcnt > 0;
					  --cblkcnt, ++cblk) {
						if (jpc_dec_decodecblk(dec, tile, tcomp,
						  band, cblk, 1, JPC_MAXLYRS)) {
							return -1;
						}
					}
				}

			}
		}
	}

	return 0;
}